

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SimplePreprocessor.hpp
# Opt level: O3

bool __thiscall
OpenMD::SimplePreprocessor::doPreprocess
          (SimplePreprocessor *this,istream *myStream,string *filename,int startingLine,ostream *os,
          set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *defineSet,stack<bool,_std::deque<bool,_std::allocator<bool>_>_> *ifStates)

{
  pointer pcVar1;
  istream *piVar2;
  char cVar3;
  bool bVar4;
  int iVar5;
  ostream *poVar6;
  long *plVar7;
  size_t sVar8;
  __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  _Var9;
  iterator iVar10;
  _Elt_pointer pbVar11;
  OpenMDException *this_00;
  long lVar12;
  int iVar13;
  ulong uVar14;
  char *pcVar15;
  pair<std::_Rb_tree_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Rb_tree_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  pVar16;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  tokens;
  string line;
  string includeFilename;
  StringTokenizer tokenizer;
  stringstream ss;
  ifstream includeStream;
  char buffer [8192];
  SimplePreprocessor local_24e9;
  _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
  *local_24e8;
  ostream *local_24e0;
  long *local_24d8;
  ulong local_24d0;
  undefined1 local_24c8;
  undefined7 uStack_24c7;
  undefined8 uStack_24c0;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_24b8;
  long *local_24a0;
  ulong local_2498;
  long local_2490;
  undefined8 uStack_2488;
  string local_2480;
  long *local_2460;
  _Base_ptr local_2458;
  string *local_2450;
  istream *local_2448;
  StringTokenizer local_2440;
  string local_23e8;
  undefined1 local_23c8 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_23b8 [23];
  istream local_2240;
  char local_2038 [8200];
  
  std::__ostream_insert<char,std::char_traits<char>>(os,"#line ",6);
  poVar6 = (ostream *)std::ostream::operator<<(os,startingLine);
  std::__ostream_insert<char,std::char_traits<char>>(poVar6," \"",2);
  poVar6 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar6,(filename->_M_dataplus)._M_p,filename->_M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar6,"\"\n",2);
  std::ios::widen((char)myStream->_vptr_basic_istream[-3] + (char)myStream);
  plVar7 = (long *)std::istream::getline((char *)myStream,(long)local_2038,'\0');
  if ((*(byte *)((long)plVar7 + *(long *)(*plVar7 + -0x18) + 0x20) & 5) == 0) {
    local_2460 = &local_2490;
    local_2458 = &(defineSet->_M_t)._M_impl.super__Rb_tree_header._M_header;
    iVar13 = startingLine + 1;
    local_24e8 = (_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                  *)defineSet;
    local_24e0 = os;
    local_2450 = filename;
    local_2448 = myStream;
    do {
      local_24d8 = (long *)&local_24c8;
      sVar8 = strlen(local_2038);
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_24d8,local_2038,local_2038 + sVar8);
      std::locale::locale((locale *)&local_2240);
      plVar7 = local_24d8;
      _Var9 = std::
              __find_if<__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>,__gnu_cxx::__ops::_Iter_pred<OpenMD::Utils::trimLeft(std::__cxx11::string&,std::locale_const&)::_lambda(auto:1)_1_>>
                        (local_24d8,(char *)((long)local_24d8 + local_24d0));
      uVar14 = (long)plVar7 - (long)local_24d8;
      if ((char *)((long)local_24d8 + local_24d0) == _Var9._M_current) {
        *(char *)((long)local_24d8 + uVar14) = '\0';
        local_24d0 = uVar14;
      }
      else {
        std::__cxx11::string::_M_erase((ulong)&local_24d8,uVar14);
      }
      local_24a0 = &local_2490;
      if (local_24d8 == (long *)&local_24c8) {
        uStack_2488 = uStack_24c0;
      }
      else {
        local_24a0 = local_24d8;
      }
      local_2490 = CONCAT71(uStack_24c7,local_24c8);
      local_2498 = local_24d0;
      local_24d0 = 0;
      local_24c8 = 0;
      local_24d8 = (long *)&local_24c8;
      std::locale::~locale((locale *)&local_2240);
      if (local_24d8 != (long *)&local_24c8) {
        operator_delete(local_24d8,CONCAT71(uStack_24c7,local_24c8) + 1);
      }
      poVar6 = local_24e0;
      if ((local_2498 == 0) || ((char)*local_24a0 != '#')) {
        pbVar11 = (ifStates->c).super__Deque_base<bool,_std::allocator<bool>_>._M_impl.
                  super__Deque_impl_data._M_finish._M_cur;
        if (pbVar11 ==
            (ifStates->c).super__Deque_base<bool,_std::allocator<bool>_>._M_impl.
            super__Deque_impl_data._M_finish._M_first) {
          pbVar11 = (ifStates->c).super__Deque_base<bool,_std::allocator<bool>_>._M_impl.
                    super__Deque_impl_data._M_finish._M_node[-1] + 0x200;
        }
        if (pbVar11[-1] == true) {
          sVar8 = strlen(local_2038);
          poVar6 = local_24e0;
          std::__ostream_insert<char,std::char_traits<char>>(local_24e0,local_2038,sVar8);
          cVar3 = (char)poVar6;
          std::ios::widen((char)*(undefined8 *)(*(long *)poVar6 + -0x18) + cVar3);
          std::ostream::put(cVar3);
          std::ostream::flush();
        }
      }
      else {
        std::__cxx11::string::substr((ulong)&local_2240,(ulong)&local_24a0);
        local_23c8._0_8_ = local_23c8 + 0x10;
        std::__cxx11::string::_M_construct<char_const*>((string *)local_23c8," ;\t\n\r","");
        StringTokenizer::StringTokenizer(&local_2440,(string *)&local_2240,(string *)local_23c8);
        if ((undefined1 *)local_23c8._0_8_ != local_23c8 + 0x10) {
          operator_delete((void *)local_23c8._0_8_,local_23b8[0]._M_allocated_capacity + 1);
        }
        if ((undefined1 *)
            CONCAT71(local_2240._vptr_basic_istream._1_7_,local_2240._vptr_basic_istream._0_1_) !=
            &local_2240.field_0x10) {
          operator_delete((undefined1 *)
                          CONCAT71(local_2240._vptr_basic_istream._1_7_,
                                   local_2240._vptr_basic_istream._0_1_),local_2240._16_8_ + 1);
        }
        StringTokenizer::getAllTokens_abi_cxx11_(&local_24b8,&local_2440);
        if (local_24b8.
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_start ==
            local_24b8.
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_finish) {
LAB_0011db0b:
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::~vector(&local_24b8);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_2440.delim_._M_dataplus._M_p != &local_2440.delim_.field_2) {
            operator_delete(local_2440.delim_._M_dataplus._M_p,
                            local_2440.delim_.field_2._M_allocated_capacity + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_2440.tokenString_._M_dataplus._M_p != &local_2440.tokenString_.field_2) {
            operator_delete(local_2440.tokenString_._M_dataplus._M_p,
                            local_2440.tokenString_.field_2._M_allocated_capacity + 1);
          }
          if (local_24a0 != &local_2490) {
            operator_delete(local_24a0,local_2490 + 1);
          }
          return false;
        }
        iVar5 = std::__cxx11::string::compare
                          ((char *)local_24b8.
                                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                   ._M_impl.super__Vector_impl_data._M_start);
        if (iVar5 == 0) {
          std::deque<bool,_std::allocator<bool>_>::pop_back(&ifStates->c);
          poVar6 = local_24e0;
          if ((ifStates->c).super__Deque_base<bool,_std::allocator<bool>_>._M_impl.
              super__Deque_impl_data._M_finish._M_cur ==
              (ifStates->c).super__Deque_base<bool,_std::allocator<bool>_>._M_impl.
              super__Deque_impl_data._M_start._M_cur) {
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)&std::cout,"Error in preprocessing: endif \n",0x1f);
            goto LAB_0011db0b;
          }
LAB_0011da0f:
          std::ios::widen((char)*(undefined8 *)(*(long *)poVar6 + -0x18) + (char)poVar6);
          std::ostream::put((char)poVar6);
          std::ostream::flush();
        }
        else {
          if ((long)local_24b8.
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_finish -
              (long)local_24b8.
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start != 0x40) goto LAB_0011db0b;
          iVar5 = std::__cxx11::string::compare
                            ((char *)local_24b8.
                                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                     ._M_impl.super__Vector_impl_data._M_start);
          if (iVar5 != 0) {
            iVar5 = std::__cxx11::string::compare
                              ((char *)local_24b8.
                                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                       ._M_impl.super__Vector_impl_data._M_start);
            if (iVar5 == 0) {
              std::
              _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
              ::_M_insert_unique<std::__cxx11::string_const&>
                        (local_24e8,
                         local_24b8.
                         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_start + 1);
            }
            else {
              iVar5 = std::__cxx11::string::compare
                                ((char *)local_24b8.
                                         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                         ._M_impl.super__Vector_impl_data._M_start);
              if (iVar5 == 0) {
                pVar16 = std::
                         _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ::equal_range((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                        *)local_24e8,
                                       local_24b8.
                                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                       ._M_impl.super__Vector_impl_data._M_start + 1);
                std::
                _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ::_M_erase_aux((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                *)local_24e8,(_Base_ptr)pVar16.first._M_node,
                               (_Base_ptr)pVar16.second._M_node);
              }
              else {
                iVar5 = std::__cxx11::string::compare
                                  ((char *)local_24b8.
                                           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                           ._M_impl.super__Vector_impl_data._M_start);
                if (iVar5 == 0) {
                  iVar10 = std::
                           _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           ::find((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                   *)local_24e8,
                                  local_24b8.
                                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                  ._M_impl.super__Vector_impl_data._M_start + 1);
                  if (iVar10._M_node == local_2458) {
                    local_2240._vptr_basic_istream._0_1_ = 0;
                    std::deque<bool,_std::allocator<bool>_>::emplace_back<bool>
                              (&ifStates->c,(bool *)&local_2240);
                  }
                  else {
                    local_2240._vptr_basic_istream._0_1_ = 1;
                    std::deque<bool,_std::allocator<bool>_>::emplace_back<bool>
                              (&ifStates->c,(bool *)&local_2240);
                  }
                }
                else {
                  iVar5 = std::__cxx11::string::compare
                                    ((char *)local_24b8.
                                             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                             ._M_impl.super__Vector_impl_data._M_start);
                  if (iVar5 != 0) {
                    poVar6 = std::__ostream_insert<char,std::char_traits<char>>
                                       ((ostream *)&std::cout,
                                        ((local_24b8.
                                          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                          ._M_impl.super__Vector_impl_data._M_start)->_M_dataplus).
                                        _M_p,(local_24b8.
                                              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                              ._M_impl.super__Vector_impl_data._M_start)->
                                             _M_string_length);
                    std::__ostream_insert<char,std::char_traits<char>>
                              (poVar6," is not supported (yet).",0x18);
                    std::endl<char,std::char_traits<char>>(poVar6);
                    goto LAB_0011db0b;
                  }
                  iVar10 = std::
                           _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           ::find((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                   *)local_24e8,
                                  local_24b8.
                                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                  ._M_impl.super__Vector_impl_data._M_start + 1);
                  if (iVar10._M_node == local_2458) {
                    local_2240._vptr_basic_istream._0_1_ = 1;
                    std::deque<bool,_std::allocator<bool>_>::emplace_back<bool>
                              (&ifStates->c,(bool *)&local_2240);
                  }
                  else {
                    local_2240._vptr_basic_istream._0_1_ = 0;
                    std::deque<bool,_std::allocator<bool>_>::emplace_back<bool>
                              (&ifStates->c,(bool *)&local_2240);
                  }
                }
              }
            }
            goto LAB_0011da0f;
          }
          local_2480._M_dataplus._M_p = (pointer)&local_2480.field_2;
          pcVar1 = local_24b8.
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start[1]._M_dataplus._M_p;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)&local_2480,pcVar1,
                     pcVar1 + local_24b8.
                              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              ._M_impl.super__Vector_impl_data._M_start[1]._M_string_length);
          std::__cxx11::string::substr((ulong)&local_2240,(ulong)&local_2480);
          std::__cxx11::string::operator=((string *)&local_2480,(string *)&local_2240);
          if ((undefined1 *)
              CONCAT71(local_2240._vptr_basic_istream._1_7_,local_2240._vptr_basic_istream._0_1_) !=
              &local_2240.field_0x10) {
            operator_delete((undefined1 *)
                            CONCAT71(local_2240._vptr_basic_istream._1_7_,
                                     local_2240._vptr_basic_istream._0_1_),local_2240._16_8_ + 1);
          }
          std::ifstream::ifstream(&local_2240,local_2480._M_dataplus._M_p,_S_in);
          cVar3 = std::__basic_file<char>::is_open();
          if (cVar3 == '\0') {
            std::__cxx11::stringstream::stringstream((stringstream *)local_23c8);
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)(local_23c8 + 0x10),"Can not open ",0xd);
            poVar6 = std::__ostream_insert<char,std::char_traits<char>>
                               ((ostream *)(local_23c8 + 0x10),local_2480._M_dataplus._M_p,
                                local_2480._M_string_length);
            std::__ostream_insert<char,std::char_traits<char>>(poVar6," for preprocessing\n",0x13);
            this_00 = (OpenMDException *)__cxa_allocate_exception(0x28);
            std::__cxx11::stringbuf::str();
            OpenMDException::OpenMDException(this_00,&local_23e8);
            __cxa_throw(this_00,&OpenMDException::typeinfo,OpenMDException::~OpenMDException);
          }
          bVar4 = doPreprocess(&local_24e9,&local_2240,&local_2480,1,poVar6,
                               (set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                *)local_24e8,ifStates);
          lVar12 = 0x17;
          poVar6 = (ostream *)&std::cout;
          pcVar15 = "Error in preprocessing\n";
          if (bVar4) {
            std::__ostream_insert<char,std::char_traits<char>>(local_24e0,"#line ",6);
            poVar6 = (ostream *)std::ostream::operator<<(local_24e0,iVar13);
            std::__ostream_insert<char,std::char_traits<char>>(poVar6," \"",2);
            poVar6 = std::__ostream_insert<char,std::char_traits<char>>
                               (poVar6,(local_2450->_M_dataplus)._M_p,local_2450->_M_string_length);
            lVar12 = 2;
            pcVar15 = "\"\n";
          }
          std::__ostream_insert<char,std::char_traits<char>>(poVar6,pcVar15,lVar12);
          std::ifstream::~ifstream(&local_2240);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_2480._M_dataplus._M_p != &local_2480.field_2) {
            operator_delete(local_2480._M_dataplus._M_p,local_2480.field_2._M_allocated_capacity + 1
                           );
          }
          if (!bVar4) goto LAB_0011db0b;
        }
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~vector(&local_24b8);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_2440.delim_._M_dataplus._M_p != &local_2440.delim_.field_2) {
          operator_delete(local_2440.delim_._M_dataplus._M_p,
                          local_2440.delim_.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_2440.tokenString_._M_dataplus._M_p != &local_2440.tokenString_.field_2) {
          operator_delete(local_2440.tokenString_._M_dataplus._M_p,
                          local_2440.tokenString_.field_2._M_allocated_capacity + 1);
        }
      }
      if (local_24a0 != &local_2490) {
        operator_delete(local_24a0,local_2490 + 1);
      }
      piVar2 = local_2448;
      std::ios::widen((char)local_2448->_vptr_basic_istream[-3] + (char)local_2448);
      plVar7 = (long *)std::istream::getline((char *)piVar2,(long)local_2038,'\0');
      iVar13 = iVar13 + 1;
    } while ((*(byte *)((long)plVar7 + *(long *)(*plVar7 + -0x18) + 0x20) & 5) == 0);
  }
  return true;
}

Assistant:

bool doPreprocess(std::istream& myStream, const std::string& filename, int startingLine, ostream& os, std::set<std::string>& defineSet, std::stack<bool>& ifStates) {
            //std::ifstream input(filename.c_str());
            //if (!input.is_open()) {
            //    std::stringstream ss;
            //    ss << "Can not open " << filename << " for preprocessing\n";
            //    
            //    snprintf(painCave.errMsg, MAX_SIM_ERROR_MSG_LENGTH,
            //            "Can not open (%s) for processing. \n"
            //            "\tPlease check md file name syntax.\n", filename.c_str());
            //    
            //    painCave.isFatal = 1;
            //    simError();
            //    
            //    throw OpenMDException(ss.str());                
            //}
            int lineNo = startingLine;
            os << "#line " << lineNo << " \"" << filename << "\"\n";
            const int bufferSize = 8192;
            char buffer[bufferSize];
            while(myStream.getline(buffer, bufferSize)) {
              ++lineNo;
              std::string line = Utils::trimLeftCopy(buffer);
              if (!line.empty() && line[0] == '#') {
                    StringTokenizer tokenizer(line.substr(1, line.length()));
                    std::vector<std::string> tokens = tokenizer.getAllTokens();
                    if (tokens.empty()) {
                        return false;
                    }
                    if (tokens[0] == "endif") {
                        ifStates.pop();
                        if (ifStates.empty()) {
                            std::cout << "Error in preprocessing: endif \n";
                            return false;
                        }
                        os << std::endl;                        
                    } else if (tokens.size() == 2) {
                        if (tokens[0] == "include") {
                            SimplePreprocessor subPreprocessor;
                            std::string includeFilename = tokens[1];
                            includeFilename = includeFilename.substr(1, includeFilename.length() -2);
                            std::ifstream includeStream(includeFilename.c_str());
                            if (!includeStream.is_open()) {
                                std::stringstream ss;
                                ss << "Can not open " << includeFilename << " for preprocessing\n";
                                throw OpenMDException(ss.str()); 
                            }
                            
                            bool ret = subPreprocessor.doPreprocess(includeStream, includeFilename, 1, os, defineSet, ifStates);
                            if (!ret) {
                                std::cout << "Error in preprocessing\n";
                                return false;
                            }
                            os << "#line " << lineNo << " \"" << filename << "\"\n";
                        } else if (tokens[0] == "define") {
                           defineSet.insert(tokens[1]);
                           os << std::endl;
                        } else if (tokens[0] == "undef") {
                           defineSet.erase(tokens[1]);
                           os << std::endl;
                        } else if (tokens[0] == "ifdef") {
                           if (defineSet.find(tokens[1]) != defineSet.end() ) {
                                ifStates.push(true);
                           } else {
                              ifStates.push(false);
                           }
                           os << std::endl;
                        } else if (tokens[0] == "ifndef") {
                           if (defineSet.find(tokens[1]) == defineSet.end() ) {
                                ifStates.push(true);
                           } else {
                              ifStates.push(false);
                           }
                           os << std::endl;
                        } else {
                            std::cout << tokens[0] << " is not supported (yet)." << std::endl;
                            return false;
                        }
                    }else {
                        return false;
                    }
                    
              }else if (ifStates.top()){
                os << buffer << std::endl;
              }
              
            }

            return true;
        }